

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

QCborValue *
taggedValueFromCbor(QCborValue *__return_storage_ptr__,QCborStreamReader *reader,
                   int remainingRecursionDepth)

{
  QCborError QVar1;
  Type TVar2;
  QCborContainerPrivate *this;
  QCborValue *result;
  long in_FS_OFFSET;
  anon_union_8_2_4ee71171_for_Element_0 local_40;
  undefined8 local_38;
  QCborValue *local_30;
  
  local_30 = *(QCborValue **)(in_FS_OFFSET + 0x28);
  if (remainingRecursionDepth == 0) {
    qt_cbor_stream_set_error
              ((reader->d)._M_t.
               super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
               .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl,
               (QCborError)0x401);
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = Invalid;
  }
  else {
    this = (QCborContainerPrivate *)operator_new(0x40);
    (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 0;
    this->usedData = 0;
    (this->data).d.d = (Data *)0x0;
    (this->data).d.ptr = (char *)0x0;
    (this->data).d.size = 0;
    (this->elements).d.d = (Data *)0x0;
    (this->elements).d.ptr = (Element *)0x0;
    (this->elements).d.size = 0;
    local_40 = (anon_union_8_2_4ee71171_for_Element_0)reader->value64;
    local_38 = 0xc0;
    QtPrivate::QPodArrayOps<QtCbor::Element>::emplace<QtCbor::Element>
              ((QPodArrayOps<QtCbor::Element> *)&this->elements,0,(Element *)&local_40);
    QList<QtCbor::Element>::end(&this->elements);
    QCborStreamReader::next((QCborStreamReader *)reader,10000);
    QVar1 = QCborStreamReader::lastError((QCborStreamReader *)reader);
    if (QVar1.c == NoError) {
      QCborContainerPrivate::decodeValueFromCbor(this,reader,remainingRecursionDepth + -1);
    }
    QVar1 = QCborStreamReader::lastError((QCborStreamReader *)reader);
    TVar2 = Invalid;
    if (QVar1.c == NoError) {
      TVar2 = convertToExtendedType(this);
    }
    *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->t = TVar2;
    __return_storage_ptr__->n = -1;
    __return_storage_ptr__->container = this;
    LOCK();
    (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (*(QCborValue **)(in_FS_OFFSET + 0x28) == local_30) {
    return *(QCborValue **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QCborValue taggedValueFromCbor(QCborStreamReader &reader, int remainingRecursionDepth)
{
    if (Q_UNLIKELY(remainingRecursionDepth == 0)) {
        QCborContainerPrivate::setErrorInReader(reader, { QCborError::NestingTooDeep });
        return QCborValue::Invalid;
    }

    auto d = new QCborContainerPrivate;
    d->append(reader.toTag());
    reader.next();

    if (reader.lastError() == QCborError::NoError) {
        // decode tagged value
        d->decodeValueFromCbor(reader, remainingRecursionDepth - 1);
    }

    QCborValue::Type type;
    if (reader.lastError() == QCborError::NoError) {
        // post-process to create our extended types
        type = convertToExtendedType(d);
    } else {
        // decoding error
        type = QCborValue::Invalid;
    }

    // note: may return invalid state!
    return QCborContainerPrivate::makeValue(type, -1, d);
}